

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_toStringForCallOrderMultiple_Test::
~TEST_MockExpectedCall_toStringForCallOrderMultiple_Test
          (TEST_MockExpectedCall_toStringForCallOrderMultiple_Test *this)

{
  TEST_MockExpectedCall_toStringForCallOrderMultiple_Test *this_local;
  
  ~TEST_MockExpectedCall_toStringForCallOrderMultiple_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, toStringForCallOrderMultiple)
{
    MockCheckedExpectedCall expectedCall(5);
    expectedCall.withName("name");
    expectedCall.withCallOrder(5, 9);
    expectedCall.callWasMade(5);
    expectedCall.callWasMade(6);
    expectedCall.callWasMade(7);
    expectedCall.callWasMade(8);
    expectedCall.callWasMade(9);
    STRCMP_EQUAL("name -> expected calls order: <5..9> -> no parameters (expected 5 calls, called 5 times)", expectedCall.callToString().asCharString());
}